

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_integral.cpp
# Opt level: O2

ScalarFunction *
duckdb::CMIntegralDecompressFun::GetFunction
          (ScalarFunction *__return_storage_ptr__,LogicalType *input_type,LogicalType *result_type)

{
  LogicalType varargs;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff14;
  FunctionNullHandling in_stack_ffffffffffffff20;
  bind_lambda_function_t in_stack_ffffffffffffff28;
  LogicalType local_d0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_b8;
  LogicalType local_a0;
  scalar_function_t local_88;
  LogicalType local_68 [2];
  string local_38;
  
  IntegralDecompressFunctionName_abi_cxx11_(&local_38,(duckdb *)result_type,result_type);
  LogicalType::LogicalType(local_68,input_type);
  LogicalType::LogicalType(local_68 + 1,result_type);
  __l._M_len = 2;
  __l._M_array = local_68;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_b8,__l,(allocator_type *)&stack0xffffffffffffff2f);
  LogicalType::LogicalType(&local_d0,result_type);
  GetIntegralDecompressFunctionInputSwitch(&local_88,input_type,result_type);
  LogicalType::LogicalType(&local_a0,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_a0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_ffffffffffffff0c;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_ffffffffffffff14;
  ScalarFunction::ScalarFunction
            (__return_storage_ptr__,&local_38,(vector<duckdb::LogicalType,_true> *)&local_b8,
             &local_d0,&local_88,CMUtils::Bind,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs,CONSISTENT,
             in_stack_ffffffffffffff20,in_stack_ffffffffffffff28);
  LogicalType::~LogicalType(&local_a0);
  ::std::_Function_base::~_Function_base(&local_88.super__Function_base);
  LogicalType::~LogicalType(&local_d0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_b8);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_68[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  ::std::__cxx11::string::~string((string *)&local_38);
  __return_storage_ptr__->serialize = CMIntegralSerialize;
  __return_storage_ptr__->deserialize =
       CMIntegralDeserialize<&duckdb::GetIntegralDecompressFunctionInputSwitch>;
  return __return_storage_ptr__;
}

Assistant:

ScalarFunction CMIntegralDecompressFun::GetFunction(const LogicalType &input_type, const LogicalType &result_type) {
	ScalarFunction result(IntegralDecompressFunctionName(result_type), {input_type, result_type}, result_type,
	                      GetIntegralDecompressFunctionInputSwitch(input_type, result_type), CMUtils::Bind);
	result.serialize = CMIntegralSerialize;
	result.deserialize = CMIntegralDeserialize<GetIntegralDecompressFunctionInputSwitch>;
	return result;
}